

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerSafe::Petition
          (Error *__return_storage_ptr__,CommissionerSafe *this,string *aExistingCommissionerId,
          string *aAddr,uint16_t aPort)

{
  promise<ot::commissioner::Error> local_98;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  local_78;
  undefined1 local_58 [8];
  anon_class_16_2_4002aa9b wait;
  promise<ot::commissioner::Error> pro;
  uint16_t aPort_local;
  string *aAddr_local;
  string *aExistingCommissionerId_local;
  CommissionerSafe *this_local;
  
  std::promise<ot::commissioner::Error>::promise
            ((promise<ot::commissioner::Error> *)&wait.aExistingCommissionerId);
  local_58 = (undefined1  [8])&wait.aExistingCommissionerId;
  wait.pro = (promise<ot::commissioner::Error> *)aExistingCommissionerId;
  std::function<void(std::__cxx11::string_const*,ot::commissioner::Error)>::
  function<ot::commissioner::CommissionerSafe::Petition(std::__cxx11::string&,std::__cxx11::string_const&,unsigned_short)::__0&,void>
            ((function<void(std::__cxx11::string_const*,ot::commissioner::Error)> *)&local_78,
             (anon_class_16_2_4002aa9b *)local_58);
  (*(this->super_Commissioner)._vptr_Commissioner[0xd])(this,&local_78,aAddr,(ulong)aPort);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_ot::commissioner::Error)>
  ::~function(&local_78);
  std::promise<ot::commissioner::Error>::get_future(&local_98);
  std::future<ot::commissioner::Error>::get
            (__return_storage_ptr__,(future<ot::commissioner::Error> *)&local_98);
  std::future<ot::commissioner::Error>::~future((future<ot::commissioner::Error> *)&local_98);
  std::promise<ot::commissioner::Error>::~promise
            ((promise<ot::commissioner::Error> *)&wait.aExistingCommissionerId);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Petition(std::string &aExistingCommissionerId, const std::string &aAddr, uint16_t aPort)
{
    std::promise<Error> pro;
    auto wait = [&pro, &aExistingCommissionerId](const std::string *existingCommissionerId, Error error) {
        if (existingCommissionerId != nullptr)
        {
            aExistingCommissionerId = *existingCommissionerId;
        }
        pro.set_value(error);
    };

    Petition(wait, aAddr, aPort);
    return pro.get_future().get();
}